

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cg-dump.cpp
# Opt level: O0

void dumpCallGraph(CallGraph *CG)

{
  bool bVar1;
  reference ppFVar2;
  ostream *poVar3;
  Function *c;
  iterator __end2;
  iterator __begin2;
  FuncVec *__range2;
  Function *f;
  iterator __end1;
  iterator __begin1;
  FuncVec *__range1;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *in_stack_ffffffffffffff08
  ;
  ostream *in_stack_ffffffffffffff10;
  ostream *in_stack_ffffffffffffff18;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *in_stack_ffffffffffffff20
  ;
  string local_d0 [8];
  StringRef *in_stack_ffffffffffffff38;
  string local_a0 [32];
  Function *local_80;
  Function **local_78;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  local_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  Function *local_48;
  undefined4 local_3c;
  Function **local_38;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  local_30;
  undefined1 local_28 [24];
  undefined1 *local_10;
  
  std::operator<<((ostream *)&std::cout,"digraph CallGraph {\n");
  dg::llvmdg::CallGraph::functions((CallGraph *)in_stack_ffffffffffffff18);
  local_10 = local_28;
  local_30._M_current =
       (Function **)
       std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin
                 (in_stack_ffffffffffffff08);
  local_38 = (Function **)
             std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
                       (in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
              ::operator*(&local_30);
    local_48 = *ppFVar2;
    dg::llvmdg::CallGraph::callees
              ((CallGraph *)in_stack_ffffffffffffff18,(Function *)in_stack_ffffffffffffff10);
    local_50 = local_68;
    local_70._M_current =
         (Function **)
         std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin
                   (in_stack_ffffffffffffff08);
    local_78 = (Function **)
               std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
                         (in_stack_ffffffffffffff08);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                          *)in_stack_ffffffffffffff10,
                         (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar1) break;
      ppFVar2 = __gnu_cxx::
                __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                ::operator*(&local_70);
      local_80 = *ppFVar2;
      in_stack_ffffffffffffff10 = std::operator<<((ostream *)&std::cout,"  \"");
      llvm::Value::getName();
      llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff38);
      poVar3 = std::operator<<(in_stack_ffffffffffffff10,local_a0);
      in_stack_ffffffffffffff18 = std::operator<<(poVar3,"\" -> \"");
      in_stack_ffffffffffffff20 =
           (vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
           llvm::Value::getName();
      llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff38);
      poVar3 = std::operator<<(in_stack_ffffffffffffff18,local_d0);
      std::operator<<(poVar3,"\"\n");
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_a0);
      __gnu_cxx::
      __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
      ::operator++(&local_70);
    }
    local_3c = 4;
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
              (in_stack_ffffffffffffff20);
    __gnu_cxx::
    __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
    ::operator++(&local_30);
  }
  local_3c = 2;
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
            (in_stack_ffffffffffffff20);
  std::operator<<((ostream *)&std::cout,"}\n");
  return;
}

Assistant:

static void dumpCallGraph(llvmdg::CallGraph &CG) {
    std::cout << "digraph CallGraph {\n";

    for (const auto *f : CG.functions()) {
        for (const auto *c : CG.callees(f)) {
            std::cout << "  \"" << f->getName().str() << "\" -> \""
                      << c->getName().str() << "\"\n";
        }
    }

    std::cout << "}\n";
}